

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderPrimitiveCounter::createAndBuildProgramWithFeedback
          (GeometryShaderPrimitiveCounter *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_3f0;
  char *geometry_shader_code_ptr;
  string geometry_shader_code;
  undefined1 local_3a8 [8];
  string n_loop_iterations_string;
  stringstream n_loop_iterations_sstream;
  undefined1 local_378 [380];
  uint local_1fc;
  string local_1f8 [4];
  GLint n_loop_iterations;
  undefined1 local_1c8 [8];
  string max_vertices_string;
  stringstream max_vertices_sstream;
  undefined1 local_198 [376];
  char *local_20;
  char *feedbackVaryings [1];
  Functions *gl;
  GeometryShaderPrimitiveCounter *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  feedbackVaryings[0] = (char *)CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(feedbackVaryings[0] + 0x3c8))();
  this->m_program_id = GVar3;
  local_20 = "test_gl_PrimitiveIDIn";
  this->m_nrVaryings = 1;
  (**(code **)(feedbackVaryings[0] + 0x14c8))
            (this->m_program_id,this->m_nrVaryings,&local_20,0x8c8c);
  dVar4 = (**(code **)(feedbackVaryings[0] + 0x800))();
  glu::checkError(dVar4,"Could not set transform feedback varyings!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x205);
  GVar3 = (**(code **)(feedbackVaryings[0] + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar3;
  GVar3 = (**(code **)(feedbackVaryings[0] + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)(feedbackVaryings[0] + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar4 = (**(code **)(feedbackVaryings[0] + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x20b);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(max_vertices_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1c8);
  (**(code **)(feedbackVaryings[0] + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
             &this->m_maxGeometryOutputVertices);
  dVar4 = (**(code **)(feedbackVaryings[0] + 0x800))();
  glu::checkError(dVar4,"Could not query GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x213);
  this->m_maxGeometryOutputVertices =
       (uint)this->m_maxGeometryOutputVertices / (this->m_n_components + this->m_nrVaryings);
  std::ostream::operator<<(local_198,this->m_maxGeometryOutputVertices);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)local_1c8,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  local_1fc = (uint)this->m_maxGeometryOutputVertices /
              (this->m_testConfiguration).m_numberOfVerticesPerOneOutputPrimitive;
  this->m_maxGeometryOutputVertices =
       local_1fc * (this->m_testConfiguration).m_numberOfVerticesPerOneOutputPrimitive;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(n_loop_iterations_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_3a8);
  std::ostream::operator<<(local_378,local_1fc);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=
            ((string *)local_3a8,(string *)(geometry_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(geometry_shader_code.field_2._M_local_buf + 8));
  GetGeometryShaderCode
            ((string *)&geometry_shader_code_ptr,this,(string *)local_1c8,
             &(this->m_testConfiguration).m_layoutIn,&(this->m_testConfiguration).m_layoutOut,
             &(this->m_testConfiguration).m_emitVertexCodeForGeometryShader,(string *)local_3a8);
  local_3f0 = (char *)std::__cxx11::string::c_str();
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_id,this->m_fragment_shader_id,1,
                     &m_fragment_shader_code,this->m_geometry_shader_id,1,&local_3f0,
                     this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program could not have been created sucessfully",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
               ,0x232);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string((string *)&geometry_shader_code_ptr);
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(n_loop_iterations_string.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(max_vertices_string.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GeometryShaderPrimitiveCounter::createAndBuildProgramWithFeedback(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object */
	m_program_id = gl.createProgram();

	/* Specify transform feedback varyings */
	const char* feedbackVaryings[] = { "test_gl_PrimitiveIDIn" };

	m_nrVaryings = sizeof(feedbackVaryings) / sizeof(char*);

	gl.transformFeedbackVaryings(m_program_id, m_nrVaryings, feedbackVaryings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set transform feedback varyings!");

	/* Create shader objects that will make up the program object */
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Retrieve GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname value and use it as argument for
	 * max_vertices layout qualifier of the geometry shader. */
	std::stringstream max_vertices_sstream;
	std::string		  max_vertices_string;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &m_maxGeometryOutputVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT!");

	m_maxGeometryOutputVertices = m_maxGeometryOutputVertices / (m_n_components + m_nrVaryings);

	max_vertices_sstream << m_maxGeometryOutputVertices;
	max_vertices_string = max_vertices_sstream.str();

	/* Calculate the possible for loops count in Geometry Shader */
	glw::GLint n_loop_iterations =
		m_maxGeometryOutputVertices / m_testConfiguration.m_numberOfVerticesPerOneOutputPrimitive;

	/* adjust the m_maxGeometryOutputVertices to be the number of emitted vertices  */
	m_maxGeometryOutputVertices = n_loop_iterations * m_testConfiguration.m_numberOfVerticesPerOneOutputPrimitive;

	std::stringstream n_loop_iterations_sstream;
	std::string		  n_loop_iterations_string;

	n_loop_iterations_sstream << n_loop_iterations;
	n_loop_iterations_string = n_loop_iterations_sstream.str();

	/* Construct geometry shader code */
	std::string geometry_shader_code =
		GetGeometryShaderCode(max_vertices_string, m_testConfiguration.m_layoutIn, m_testConfiguration.m_layoutOut,
							  m_testConfiguration.m_emitVertexCodeForGeometryShader, n_loop_iterations_string);

	const char* geometry_shader_code_ptr = (const char*)geometry_shader_code.c_str();

	/* Build program */
	if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_geometry_shader_id, 1,
					  &geometry_shader_code_ptr, m_vertex_shader_id, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Program could not have been created sucessfully");
	}
}